

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O2

void apriltag_detector_clear_families(apriltag_detector_t *td)

{
  int iVar1;
  int i;
  int idx;
  apriltag_family_t *fam;
  apriltag_family_t *local_20;
  
  idx = 0;
  while( true ) {
    iVar1 = zarray_size(td->tag_families);
    if (iVar1 <= idx) break;
    zarray_get(td->tag_families,idx,&local_20);
    quick_decode_uninit(local_20);
    idx = idx + 1;
  }
  zarray_clear(td->tag_families);
  return;
}

Assistant:

void apriltag_detector_clear_families(apriltag_detector_t *td)
{
    for (int i = 0; i < zarray_size(td->tag_families); i++) {
        apriltag_family_t *fam;
        zarray_get(td->tag_families, i, &fam);
        quick_decode_uninit(fam);
    }
    zarray_clear(td->tag_families);
}